

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::Demangle(char *mangled,char *out,size_t out_size)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  undefined1 local_40 [8];
  State state;
  
  state.out_begin = out + out_size;
  state.out_end = (char *)0x0;
  state.prev_name = (char *)0x1ffffffffffff;
  local_40 = (undefined1  [8])mangled;
  state.mangled_cur = out;
  state.out_cur = out;
  bVar3 = ParseMangledName((State *)local_40);
  if (bVar3) {
    bVar6 = 1;
    cVar1 = *(char *)local_40;
    if (cVar1 == '\0') goto LAB_0011f2f9;
    lVar4 = 0;
    cVar5 = cVar1;
    while (cVar5 == '.') {
      if (0x19 < (byte)((*(byte *)((long)local_40 + lVar4 + 1) & 0xdf) + 0xbf)) goto LAB_0011f2e8;
      lVar2 = lVar4 + 3;
      do {
        lVar4 = lVar2;
        lVar2 = lVar4 + 1;
      } while ((byte)((*(byte *)((long)local_40 + lVar4 + -1) & 0xdf) + 0xbf) < 0x1a);
      if ((*(byte *)((long)local_40 + lVar4 + -1) != 0x2e) ||
         (9 < (byte)(*(char *)((long)local_40 + lVar4) - 0x30U))) goto LAB_0011f2e8;
      do {
        cVar5 = *(char *)((long)local_40 + lVar4 + 1);
        lVar4 = lVar4 + 1;
      } while ((byte)(cVar5 - 0x30U) < 10);
    }
    if (cVar5 == '\0') goto LAB_0011f2f9;
LAB_0011f2e8:
    if (cVar1 == '@') {
      MaybeAppend((State *)local_40,(char *)local_40);
      goto LAB_0011f2f9;
    }
  }
  bVar6 = 0;
LAB_0011f2f9:
  return (bool)((state.prev_name._7_1_ ^ 1) & bVar6);
}

Assistant:

bool Demangle(const char *mangled, char *out, size_t out_size) {
#if defined(GLOG_OS_WINDOWS)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char *lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char *rparen = strchr(lparen, ')');
    size_t length = static_cast<size_t>(rparen - lparen) - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  } // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}